

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidSliceStaticNoParams(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  ConvolutionLayerParams *this;
  WeightParams *pWVar3;
  bool bVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  TypeUnion this_00;
  Type *this_01;
  SliceStaticLayerParams *this_02;
  ostream *poVar9;
  string *psVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  Result res1;
  Model m;
  Result res5;
  Result res4;
  Result res3;
  Result res2;
  undefined1 local_110 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Model local_e8;
  Result local_b8;
  Result local_90;
  Result local_68;
  Result local_40;
  
  CoreML::Specification::Model::Model(&local_e8);
  if (local_e8.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_e8.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_e8.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_110 + 0x10;
  local_110._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_110);
  if ((pointer)local_110._0_8_ != pcVar2) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  iVar13 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 3;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 5;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar13 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 2;
  if (local_e8.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_e8.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_e8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_110._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_110);
  if ((pointer)local_110._0_8_ != pcVar2) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  iVar13 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 3;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 5;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar13 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 2;
  if (local_e8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_e8);
    local_e8._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_e8.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  (local_e8.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_e8.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"output");
  if (this_01->_oneof_case_[0] != 0x3e3) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0x3e3;
    this_02 = (SliceStaticLayerParams *)operator_new(0xa0);
    CoreML::Specification::SliceStaticLayerParams::SliceStaticLayerParams(this_02);
    (this_01->layer_).slicestatic_ = this_02;
  }
  this = (this_01->layer_).convolution_;
  iVar13 = (this->outputshape_).total_size_;
  if ((this->outputshape_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<bool>::Reserve
              ((RepeatedField<bool> *)&this->outputshape_,iVar13 + 1);
  }
  iVar13 = (this->outputshape_).current_size_;
  (this->outputshape_).current_size_ = iVar13 + 1;
  *(bool *)((long)((this->outputshape_).rep_)->elements + (long)iVar13) = true;
  CoreML::validate<(MLModelType)500>((Result *)local_110,&local_e8);
  bVar4 = CoreML::Result::good((Result *)local_110);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1575);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  else {
    psVar10 = CoreML::Result::message_abi_cxx11_((Result *)local_110);
    lVar11 = std::__cxx11::string::find((char *)psVar10,0x3028a0,0);
    if (lVar11 != -1) {
      iVar13 = (this->kernelsize_).total_size_;
      if ((this->kernelsize_).current_size_ == iVar13) {
        google::protobuf::RepeatedField<long>::Reserve
                  ((RepeatedField<long> *)&this->kernelsize_,iVar13 + 1);
      }
      iVar13 = (this->kernelsize_).current_size_;
      (this->kernelsize_).current_size_ = iVar13 + 1;
      ((this->kernelsize_).rep_)->elements[iVar13] = 0;
      CoreML::validate<(MLModelType)500>(&local_40,&local_e8);
      bVar4 = CoreML::Result::good(&local_40);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x157b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
LAB_00193f73:
        std::ostream::put((char)poVar9);
        iVar13 = 1;
        std::ostream::flush();
      }
      else {
        psVar10 = CoreML::Result::message_abi_cxx11_(&local_40);
        lVar11 = std::__cxx11::string::find((char *)psVar10,0x3028f1,0);
        if (lVar11 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x157c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"res2.message().find(\"End IDs\") != std::string::npos",0x33);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          goto LAB_00193f73;
        }
        iVar13 = (this->dilationfactor_).total_size_;
        if ((this->dilationfactor_).current_size_ == iVar13) {
          google::protobuf::RepeatedField<long>::Reserve
                    ((RepeatedField<long> *)&this->dilationfactor_,iVar13 + 1);
        }
        iVar13 = (this->dilationfactor_).current_size_;
        (this->dilationfactor_).current_size_ = iVar13 + 1;
        ((this->dilationfactor_).rep_)->elements[iVar13] = 5;
        CoreML::validate<(MLModelType)500>(&local_68,&local_e8);
        bVar4 = CoreML::Result::good(&local_68);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1581);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res3).good())",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          iVar13 = 1;
          std::ostream::flush();
        }
        else {
          psVar10 = CoreML::Result::message_abi_cxx11_(&local_68);
          lVar11 = std::__cxx11::string::find((char *)psVar10,0x30293e,0);
          if (lVar11 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1582);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"res3.message().find(\"Strides\") != std::string::npos",0x33);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9," was false, expected true.",0x1a);
            iVar13 = 1;
            std::endl<char,std::char_traits<char>>(poVar9);
          }
          else {
            iVar13 = ((RepeatedField<long> *)&this->weights_)->total_size_;
            if (((RepeatedField<long> *)&this->weights_)->current_size_ == iVar13) {
              google::protobuf::RepeatedField<long>::Reserve
                        ((RepeatedField<long> *)&this->weights_,iVar13 + 1);
            }
            pWVar3 = this->bias_;
            iVar13 = ((RepeatedField<long> *)&this->weights_)->current_size_;
            ((RepeatedField<long> *)&this->weights_)->current_size_ = iVar13 + 1;
            (&pWVar3->_internal_metadata_)[iVar13].
            super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
            .ptr_ = (void *)0x1;
            CoreML::validate<(MLModelType)500>(&local_90,&local_e8);
            bVar4 = CoreML::Result::good(&local_90);
            if (bVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                         ,0x6c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1587);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res4).good())",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9," was false, expected true.",0x1a);
LAB_0019428e:
              iVar13 = 1;
              std::endl<char,std::char_traits<char>>(poVar9);
            }
            else {
              psVar10 = CoreML::Result::message_abi_cxx11_(&local_90);
              lVar11 = std::__cxx11::string::find((char *)psVar10,0x30298b,0);
              if (lVar11 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1588);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"res4.message().find(\"Begin masks\") != std::string::npos",0x37);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9," was false, expected true.",0x1a);
                goto LAB_0019428e;
              }
              CoreML::Specification::SliceStaticLayerParams::add_beginmasks
                        ((SliceStaticLayerParams *)this,true);
              (this->outputshape_).current_size_ = 0;
              CoreML::validate<(MLModelType)500>(&local_b8,&local_e8);
              bVar4 = CoreML::Result::good(&local_b8);
              if (bVar4) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158e);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res5).good())",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9," was false, expected true.",0x1a);
LAB_0019434c:
                iVar13 = 1;
                std::endl<char,std::char_traits<char>>(poVar9);
              }
              else {
                psVar10 = CoreML::Result::message_abi_cxx11_(&local_b8);
                iVar13 = 0;
                lVar11 = std::__cxx11::string::find((char *)psVar10,0x3029e0,0);
                if (lVar11 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             ,0x6c);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158f);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"res5.message().find(\"End masks\") != std::string::npos",0x35);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9," was false, expected true.",0x1a);
                  goto LAB_0019434c;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8.m_message._M_dataplus._M_p != &local_b8.m_message.field_2) {
                operator_delete(local_b8.m_message._M_dataplus._M_p,
                                local_b8.m_message.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90.m_message._M_dataplus._M_p != &local_90.m_message.field_2) {
              operator_delete(local_90.m_message._M_dataplus._M_p,
                              local_90.m_message.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.m_message._M_dataplus._M_p != &local_68.m_message.field_2) {
          operator_delete(local_68.m_message._M_dataplus._M_p,
                          local_68.m_message.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40.m_message._M_dataplus._M_p != &local_40.m_message.field_2) {
        operator_delete(local_40.m_message._M_dataplus._M_p,
                        local_40.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001943d7;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1576);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"res1.message().find(\"Begin IDs\") != std::string::npos",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  std::ostream::put((char)poVar9);
  iVar13 = 1;
  std::ostream::flush();
LAB_001943d7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._8_8_ != &local_f8) {
    operator_delete((void *)local_110._8_8_,local_f8._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_e8);
  return iVar13;
}

Assistant:

int testInvalidSliceStaticNoParams() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // missing required parameters

    auto* params = layers->mutable_slicestatic();
    params->add_endmasks(true);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Begin IDs") != std::string::npos);

    params->add_beginids(0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("End IDs") != std::string::npos);

    params->add_endids(5);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Strides") != std::string::npos);

    params->add_strides(1);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Begin masks") != std::string::npos);

    params->add_beginmasks(true);
    params->clear_endmasks();

    Result res5 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res5);
    ML_ASSERT(res5.message().find("End masks") != std::string::npos);

    return 0;

}